

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

void __thiscall
fmt::internal::PrintfArgFormatter<wchar_t>::visit_bool(PrintfArgFormatter<wchar_t> *this,bool value)

{
  FormatSpec *spec;
  StringValue<char> local_18;
  undefined8 local_8;
  
  spec = (this->super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>).spec_;
  if (spec->type_ == 's') {
    spec->type_ = '\0';
    local_18.value = "false";
    if (value) {
      local_18.value = "true";
    }
    local_18.size = (ulong)value ^ 5;
    BasicWriter<wchar_t>::write_str<char>
              ((this->super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>).
               writer_,&local_18,spec);
  }
  else {
    local_8._0_4_ = spec->precision_;
    local_8._4_1_ = spec->type_;
    local_8._5_3_ = *(undefined3 *)&spec->field_0x15;
    local_18.value = *(char **)&(spec->super_AlignSpec).super_WidthSpec;
    local_18.size = *(size_t *)&(spec->super_AlignSpec).align_;
    BasicWriter<wchar_t>::write_int<bool,fmt::FormatSpec>
              ((this->super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>).
               writer_,value,*spec);
  }
  return;
}

Assistant:

void visit_bool(bool value) {
    FormatSpec &fmt_spec = this->spec();
    if (fmt_spec.type_ != 's')
      return this->visit_any_int(value);
    fmt_spec.type_ = 0;
    this->write(value);
  }